

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

iterator __thiscall
eastl::vector<eastl::pair<char,_int>,_eastl::allocator>::erase
          (vector<eastl::pair<char,_int>,_eastl::allocator> *this,iterator first,iterator last)

{
  pair<char,_int> *first_00;
  iterator position;
  iterator last_local;
  iterator first_local;
  vector<eastl::pair<char,_int>,_eastl::allocator> *this_local;
  
  first_00 = copy<eastl::pair<char,int>*,eastl::pair<char,int>*>
                       (last,(this->super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>).
                             mpEnd,first);
  DoDestroyValues(this,first_00,
                  (this->super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>).mpEnd);
  (this->super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>).mpEnd =
       (this->super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>).mpEnd +
       -((long)last - (long)first >> 3);
  return first;
}

Assistant:

inline typename vector<T, Allocator>::iterator
    vector<T, Allocator>::erase(iterator first, iterator last)
    {
#if EASTL_ASSERT_ENABLED
            if(EASTL_UNLIKELY((first < mpBegin) || (first > mpEnd) || (last < mpBegin) || (last > mpEnd) || (last < first)))
                EASTL_FAIL_MSG("vector::erase -- invalid position");
#endif
 
        //#if 0 
            // Reference implementation, known to be correct:
            iterator const position = eastl::copy(last, mpEnd, first);
            DoDestroyValues(position, mpEnd);
            mpEnd -= (last - first);
        //#else 
        //    To do: Test this.
        //    // Implementation that has an optimization for memcpy which eastl::copy cannot do (the best it can do is memmove).
        //    iterator position;
        //    T* const pEnd = mpEnd - (last - first);
        //
        //    if((pEnd <= last) && eastl::has_trivial_assign<value_type>::value) // If doing a non-overlapping copy and the data is memcpy-able
        //    {
        //        const size_t size = (size_t)((uintptr_t)mpEnd-(uintptr_t)last);
        //        position = (T*)((uintptr_t)memcpy(first, last, size) + size);
        //    }
        //    else
        //        position = eastl::copy(last, mpEnd, first);
        //
        //    DoDestroyValues(position, mpEnd);
        //    mpEnd = pEnd;
        //#endif
 
        return first;
    }